

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

simdjson_result<simdjson::dom::element> * __thiscall
simdjson::dom::object::at_key
          (simdjson_result<simdjson::dom::element> *__return_storage_ptr__,object *this,
          string_view key)

{
  bool bVar1;
  tape_ref local_f0;
  size_t local_e0;
  char *local_d8;
  undefined1 local_d0 [8];
  iterator field;
  iterator end_field;
  object *this_local;
  string_view key_local;
  element local_78;
  undefined4 local_64;
  simdjson_result<simdjson::dom::element> *local_60;
  element *local_58;
  error_code local_4c;
  element *local_48;
  simdjson_result<simdjson::dom::element> *local_40;
  element *local_38;
  tape_ref *local_30;
  simdjson_result<simdjson::dom::element> *local_28;
  error_code local_1c;
  tape_ref *local_18;
  simdjson_result<simdjson::dom::element> *local_10;
  
  join_0x00000010_0x00000000_ = (tape_ref)end(this);
  _local_d0 = (tape_ref)begin(this);
  while( true ) {
    bVar1 = iterator::operator!=((iterator *)local_d0,(iterator *)&field.tape.json_index);
    if (!bVar1) {
      local_64 = 0x13;
      local_58 = &local_78;
      local_78.tape.doc = (document *)0x0;
      local_78.tape.json_index = 0;
      local_4c = NO_SUCH_FIELD;
      local_60 = __return_storage_ptr__;
      local_48 = local_58;
      local_40 = __return_storage_ptr__;
      local_38 = local_58;
      std::pair<simdjson::dom::element,_simdjson::error_code>::
      pair<simdjson::dom::element,_simdjson::error_code_&,_true>
                ((pair<simdjson::dom::element,_simdjson::error_code> *)__return_storage_ptr__,
                 local_58,&local_4c);
      return __return_storage_ptr__;
    }
    local_e0 = key._M_len;
    local_d8 = key._M_str;
    bVar1 = iterator::key_equals((iterator *)local_d0,key);
    if (bVar1) break;
    iterator::operator++((iterator *)local_d0);
  }
  local_f0 = (tape_ref)iterator::value((iterator *)local_d0);
  local_30 = &local_f0;
  local_1c = SUCCESS;
  local_28 = __return_storage_ptr__;
  local_18 = local_30;
  local_10 = __return_storage_ptr__;
  std::pair<simdjson::dom::element,_simdjson::error_code>::
  pair<simdjson::dom::element,_simdjson::error_code_&,_true>
            ((pair<simdjson::dom::element,_simdjson::error_code> *)__return_storage_ptr__,
             (element *)local_30,&local_1c);
  return __return_storage_ptr__;
}

Assistant:

inline simdjson_result<element> object::at_key(std::string_view key) const noexcept {
  iterator end_field = end();
  for (iterator field = begin(); field != end_field; ++field) {
    if (field.key_equals(key)) {
      return field.value();
    }
  }
  return NO_SUCH_FIELD;
}